

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O0

size_t __thiscall CoreML::Specification::Pipeline::ByteSizeLong(Pipeline *this)

{
  uint uVar1;
  int iVar2;
  Model *value;
  size_t sVar3;
  string *value_00;
  int cached_size;
  int n;
  int i_1;
  uint i;
  uint count;
  size_t total_size;
  Pipeline *this_local;
  
  uVar1 = models_size(this);
  _i = (size_t)uVar1;
  for (n = 0; (uint)n < uVar1; n = n + 1) {
    value = models(this,n);
    sVar3 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::Model>(value);
    _i = sVar3 + _i;
  }
  iVar2 = names_size(this);
  sVar3 = google::protobuf::internal::FromIntSize(iVar2);
  _i = sVar3 + _i;
  cached_size = 0;
  iVar2 = names_size(this);
  for (; cached_size < iVar2; cached_size = cached_size + 1) {
    value_00 = names_abi_cxx11_(this,cached_size);
    sVar3 = google::protobuf::internal::WireFormatLite::StringSize(value_00);
    _i = sVar3 + _i;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(_i);
  this->_cached_size_ = iVar2;
  return _i;
}

Assistant:

size_t Pipeline::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.Pipeline)
  size_t total_size = 0;

  // repeated .CoreML.Specification.Model models = 1;
  {
    unsigned int count = this->models_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->models(i));
    }
  }

  // repeated string names = 2;
  total_size += 1 *
      ::google::protobuf::internal::FromIntSize(this->names_size());
  for (int i = 0, n = this->names_size(); i < n; i++) {
    total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
      this->names(i));
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}